

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.h
# Opt level: O1

void __thiscall
TPZFYsmpMatrix<long_double>::SetData
          (TPZFYsmpMatrix<long_double> *this,TPZVec<long> *IA,TPZVec<long> *JA,
          TPZVec<long_double> *A)

{
  if (IA->fNElements != (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow + 1) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzysmp.h",
               0x10f);
  }
  if (JA->fNElements != IA->fStore[(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow]) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzysmp.h",
               0x113);
  }
  TPZVec<long>::operator=(&this->fIA,IA);
  TPZVec<long>::operator=(&this->fJA,JA);
  TPZVec<long_double>::operator=(&this->fA,A);
  return;
}

Assistant:

inline void TPZFYsmpMatrix<TVar>::SetData( TPZVec<int64_t> &IA, TPZVec<int64_t> &JA, TPZVec<TVar> &A ){
    
    if (IA.size() != this->Rows() + 1 ) {
        DebugStop();
    }
    
    if (JA.size() != IA[this->Rows()]) {
        DebugStop();
    }
    
    fIA = IA;
    fJA = JA;
    fA = A;
}